

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewFunctionProcessingVisitor.cpp
# Opt level: O3

void __thiscall
NewFunctionProcessingVisitor::Visit
          (NewFunctionProcessingVisitor *this,VariableDeclaration *variable_declaration)

{
  Type *type;
  pointer pcVar1;
  PrimitiveSimpleObject *this_00;
  ArrayType *type_00;
  size_t sVar2;
  string local_a8;
  Symbol local_88;
  string local_68;
  Symbol local_48;
  
  type = variable_declaration->type_;
  if ((type->type_name_)._M_dataplus._M_p[(type->type_name_)._M_string_length - 1] == ']') {
    this_00 = (PrimitiveSimpleObject *)operator_new(0x10);
    type_00 = (ArrayType *)__dynamic_cast(type,&Type::typeinfo,&ArrayType::typeinfo,0);
    PrimitiveArrayObject::PrimitiveArrayObject((PrimitiveArrayObject *)this_00,type_00);
  }
  else {
    this_00 = (PrimitiveSimpleObject *)operator_new(0x18);
    PrimitiveSimpleObject::PrimitiveSimpleObject(this_00,type);
  }
  sVar2 = FrameEmulator::AllocVariable(&this->frame_,&this_00->super_PrimitiveObject);
  pcVar1 = (variable_declaration->variable_name_)._M_dataplus._M_p;
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,pcVar1,
             pcVar1 + (variable_declaration->variable_name_)._M_string_length);
  Symbol::Symbol(&local_48,&local_68);
  FunctionTable::CreateVariable(&this->table_,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48.name_._M_dataplus._M_p != &local_48.name_.field_2) {
    operator_delete(local_48.name_._M_dataplus._M_p,local_48.name_.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  pcVar1 = (variable_declaration->variable_name_)._M_dataplus._M_p;
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a8,pcVar1,
             pcVar1 + (variable_declaration->variable_name_)._M_string_length);
  Symbol::Symbol(&local_88,&local_a8);
  FunctionTable::Put(&this->table_,&local_88,(int)sVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88.name_._M_dataplus._M_p != &local_88.name_.field_2) {
    operator_delete(local_88.name_._M_dataplus._M_p,local_88.name_.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void NewFunctionProcessingVisitor::Visit(
    VariableDeclaration* variable_declaration) {
  size_t index;

  if (variable_declaration->type_->type_name_.back() != ']') {
    index = frame_.AllocVariable(
        new PrimitiveSimpleObject(variable_declaration->type_));
  } else {
    index = frame_.AllocVariable(new PrimitiveArrayObject(
        dynamic_cast<ArrayType*>(variable_declaration->type_)));
  }

  table_.CreateVariable(Symbol(variable_declaration->variable_name_));
  table_.Put(Symbol(variable_declaration->variable_name_), index);
}